

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O2

int Abc_NtkRecAddCut3(If_Man_t *pIfMan,If_Obj_t *pRoot,If_Cut_t *pCut)

{
  Vec_Ptr_t *vNodes;
  Gia_Man_t *p;
  Gia_Man_t *pGVar1;
  Lms_Man_t *pLVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  word *pwVar7;
  abctime aVar8;
  word *pwVar9;
  abctime aVar10;
  Gia_Obj_t *pGVar11;
  If_Obj_t *pIVar12;
  uint *puVar13;
  uint uVar14;
  int iLit0;
  ulong uVar16;
  int i;
  int iVar17;
  char pCanonPerm [16];
  ulong uVar15;
  
  pLVar2 = s_pMan3;
  uVar14 = *(uint *)&pCut->field_0x1c;
  vNodes = s_pMan3->vNodes;
  p = s_pMan3->pGia;
  s_pMan3->nTried = s_pMan3->nTried + 1;
  if (pLVar2->nVars != (uint)(byte)pCut->field_0x1e) {
    __assert_fail("p->nVars == (int)pCut->nLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                  ,0x2c3,"int Abc_NtkRecAddCut3(If_Man_t *, If_Obj_t *, If_Cut_t *)");
  }
  if (0x1ffffff < uVar14) {
    uVar14 = uVar14 >> 0x18;
    uVar15 = (ulong)uVar14;
    if (uVar14 == 2) {
      pwVar7 = If_CutTruthW(pIfMan,pCut);
      iVar3 = Abc_TtSupportSize(pwVar7,2);
      if (iVar3 != 2) goto LAB_002ae999;
    }
    aVar8 = Abc_Clock();
    pwVar7 = pLVar2->pTemp1;
    pwVar9 = If_CutTruthW(pIfMan,pCut);
    memcpy(pwVar7,pwVar9,(long)pLVar2->nWords << 3);
    uVar4 = Abc_TtCanonicize(pwVar7,uVar14,pCanonPerm);
    Abc_TtStretch5((uint *)pwVar7,uVar14,pLVar2->nVars);
    aVar10 = Abc_Clock();
    pLVar2->timeCanon = pLVar2->timeCanon + (aVar10 - aVar8);
    pGVar1 = pLVar2->pGia;
    aVar8 = Abc_Clock();
    if (pGVar1 == (Gia_Man_t *)0x0) {
      Vec_MemHashInsert(pLVar2->vTtMem,pwVar7);
      pLVar2->nAdded = pLVar2->nAdded + 1;
      aVar10 = Abc_Clock();
      pLVar2->timeInsert = pLVar2->timeInsert + (aVar10 - aVar8);
      return 1;
    }
    If_CutTraverse(pIfMan,pRoot,pCut,vNodes);
    aVar10 = Abc_Clock();
    pLVar2->timeTruth = pLVar2->timeTruth + (aVar10 - aVar8);
    if (vNodes->nSize < 0xfe) {
      aVar8 = Abc_Clock();
      for (uVar16 = 0; uVar15 != uVar16; uVar16 = uVar16 + 1) {
        pGVar11 = Gia_ManPi(p,(uint)uVar16);
        iVar3 = Gia_ObjId(p,pGVar11);
        iVar3 = Abc_Var2Lit(iVar3,(uint)((uVar4 >> ((uint)uVar16 & 0x1f) & 1) != 0));
        pIVar12 = If_ManObj(pIfMan,(int)(&pCut[1].Area)[pCanonPerm[uVar16]]);
        (pIVar12->field_22).iCopy = iVar3;
      }
      iVar3 = vNodes->nSize;
      if (iVar3 < 1) {
        __assert_fail("Vec_PtrSize(vNodes) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x2fc,"int Abc_NtkRecAddCut3(If_Man_t *, If_Obj_t *, If_Cut_t *)");
      }
      puVar13 = (uint *)0x0;
      iVar17 = 0;
      while (i = (int)uVar15, i < iVar3) {
        puVar13 = (uint *)Vec_PtrEntry(vNodes,i);
        uVar6 = 0;
        iVar5 = 1;
        if ((*puVar13 & 0xf) != 2) {
          iVar3 = Abc_LitNotCond(*(int *)(*(long *)(puVar13 + 6) + 0x40),*puVar13 >> 4 & 1);
          iVar5 = Abc_LitNotCond(*(int *)(*(long *)(puVar13 + 8) + 0x40),*puVar13 >> 5 & 1);
          uVar6 = Gia_ManHashAnd(p,iVar3,iVar5);
          iVar5 = iVar17;
        }
        puVar13[0x10] = uVar6;
        iVar3 = vNodes->nSize;
        iVar17 = iVar5;
        uVar15 = (ulong)(i + 1);
      }
      pLVar2->nHoleInTheWall = pLVar2->nHoleInTheWall + iVar17;
      aVar10 = Abc_Clock();
      pLVar2->timeBuild = pLVar2->timeBuild + (aVar10 - aVar8);
      if ((*puVar13 & 0xf) == 4) {
        iVar3 = Abc_Lit2Var(puVar13[0x10]);
        pGVar11 = Gia_ManObj(p,iVar3);
        if ((*(ulong *)pGVar11 >> 0x3e & 1) != 0) {
          pLVar2->nFilterSame = pLVar2->nFilterSame + 1;
          return 1;
        }
        *(ulong *)pGVar11 = *(ulong *)pGVar11 | 0x4000000000000000;
        iVar3 = Abc_LitNotCond(puVar13[0x10],(uint)((uVar4 >> (uVar14 & 0x1f) & 1) != 0));
        Gia_ManAppendCo(p,iVar3);
        aVar8 = Abc_Clock();
        pGVar11 = Gia_ManCo(p,p->vCos->nSize + -1);
        pwVar9 = Gia_ObjComputeTruthTable(p,pGVar11);
        aVar10 = Abc_Clock();
        pLVar2->timeCheck = pLVar2->timeCheck + (aVar10 - aVar8);
        iVar3 = bcmp(pwVar7,pwVar9,(long)pLVar2->nWords << 3);
        if (iVar3 != 0) {
          Gia_ManPatchCoDriver(p,p->vCos->nSize + -1,iLit0);
          Vec_IntPush(pLVar2->vTruthIds,-1);
          pLVar2->nFilterTruth = pLVar2->nFilterTruth + 1;
          return 1;
        }
        aVar8 = Abc_Clock();
        iVar3 = Vec_MemHashInsert(pLVar2->vTtMem,pwVar7);
        Vec_IntPush(pLVar2->vTruthIds,iVar3);
        if (p->vCos->nSize == pLVar2->vTruthIds->nSize) {
          pLVar2->nAdded = pLVar2->nAdded + 1;
          aVar10 = Abc_Clock();
          pLVar2->timeInsert = pLVar2->timeInsert + (aVar10 - aVar8);
          return 1;
        }
        __assert_fail("Gia_ManCoNum(pGia) == Vec_IntSize(p->vTruthIds)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x330,"int Abc_NtkRecAddCut3(If_Man_t *, If_Obj_t *, If_Cut_t *)");
      }
      __assert_fail("If_ObjIsAnd(pIfObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                    ,0x30d,"int Abc_NtkRecAddCut3(If_Man_t *, If_Obj_t *, If_Cut_t *)");
    }
  }
LAB_002ae999:
  pLVar2->nFilterSize = pLVar2->nFilterSize + 1;
  return 1;
}

Assistant:

int Abc_NtkRecAddCut3( If_Man_t * pIfMan, If_Obj_t * pRoot, If_Cut_t * pCut )
{
    Lms_Man_t * p = s_pMan3;
    char pCanonPerm[LMS_VAR_MAX];
    unsigned uCanonPhase;
    int i, Index, iFanin0, iFanin1, fHole;
    int nLeaves = If_CutLeaveNum(pCut);
    Vec_Ptr_t * vNodes = p->vNodes;
    Gia_Man_t * pGia = p->pGia;
    Gia_Obj_t * pDriver;
    If_Obj_t * pIfObj = NULL;
    word * pTruth;
    abctime clk;
    p->nTried++;

    // skip small cuts
    assert( p->nVars == (int)pCut->nLimit );
    if ( nLeaves < 2 || (nLeaves == 2 && Abc_TtSupportSize(If_CutTruthW(pIfMan, pCut), 2) != 2) )
    {
        p->nFilterSize++;
        return 1;
    }

//    if ( p->vTtMem2 )
//        Vec_MemHashInsert( p->vTtMem2, If_CutTruthW(pCut) );

    // semi-canonicize truth table
clk = Abc_Clock();
    memcpy( p->pTemp1, If_CutTruthW(pIfMan, pCut), p->nWords * sizeof(word) );
#ifdef LMS_USE_OLD_FORM
    uCanonPhase = Kit_TruthSemiCanonicize( (unsigned *)p->pTemp1, (unsigned *)p->pTemp2, nLeaves, pCanonPerm );
#else
    uCanonPhase = Abc_TtCanonicize( p->pTemp1, nLeaves, pCanonPerm );
#endif
    Abc_TtStretch5( (unsigned *)p->pTemp1, nLeaves, p->nVars );
p->timeCanon += Abc_Clock() - clk;
    // pCanonPerm and uCanonPhase show what was the variable corresponding to each var in the current truth

    if ( p->pGia == NULL )
    {
clk = Abc_Clock();
        // add the resulting truth table to the hash table 
        Index = Vec_MemHashInsert( p->vTtMem, p->pTemp1 );
/*
        if ( p->vTruthFreqs == NULL )
            p->vTruthFreqs = Vec_IntAlloc( 1000 );
        assert( Index <= Vec_IntSize(p->vTruthFreqs)  );
        if ( Index < Vec_IntSize(p->vTruthFreqs) )
            Vec_IntAddToEntry( p->vTruthFreqs, Index, 1 );
        else
            Vec_IntPush( p->vTruthFreqs, 1 );
*/
        p->nAdded++;
p->timeInsert += Abc_Clock() - clk;
        return 1;
    }

    // collect internal nodes and skip redundant cuts
clk = Abc_Clock();
    If_CutTraverse( pIfMan, pRoot, pCut, vNodes );
p->timeTruth += Abc_Clock() - clk;
    if ( Vec_PtrSize(vNodes) > 253 )
    {
        p->nFilterSize++;
        return 1;
    }

clk = Abc_Clock();
    // map cut leaves into elementary variables of GIA
    for ( i = 0; i < nLeaves; i++ )
        If_ManObj( pIfMan, pCut->pLeaves[(int)pCanonPerm[i]] )->iCopy = Abc_Var2Lit( Gia_ObjId(pGia, Gia_ManPi(pGia, i)), (uCanonPhase >> i) & 1 );
    // build internal nodes
    fHole = 0;
    assert( Vec_PtrSize(vNodes) > 0 );
    Vec_PtrForEachEntryStart( If_Obj_t *, vNodes, pIfObj, i, nLeaves )
    {
        if ( If_ObjIsCi(pIfObj) )
        {
            pIfObj->iCopy = 0;
            fHole = 1;
            continue;
        }
        iFanin0 = Abc_LitNotCond( If_ObjFanin0(pIfObj)->iCopy, If_ObjFaninC0(pIfObj) );
        iFanin1 = Abc_LitNotCond( If_ObjFanin1(pIfObj)->iCopy, If_ObjFaninC1(pIfObj) );
        pIfObj->iCopy = Gia_ManHashAnd( pGia, iFanin0, iFanin1 );
    }
    p->nHoleInTheWall += fHole;
p->timeBuild += Abc_Clock() - clk;

    // check if this node is already driving a PO
    assert( If_ObjIsAnd(pIfObj) );
    pDriver = Gia_ManObj(pGia, Abc_Lit2Var(pIfObj->iCopy));
    if ( pDriver->fMark1 )
    {
        p->nFilterSame++;
        return 1;
    }
    pDriver->fMark1 = 1;
    // create output
    Gia_ManAppendCo( pGia, Abc_LitNotCond( pIfObj->iCopy, (uCanonPhase >> nLeaves) & 1 ) );

    // verify truth table
clk = Abc_Clock();
    pTruth = Gia_ObjComputeTruthTable( pGia, Gia_ManCo(pGia, Gia_ManCoNum(pGia)-1) );
p->timeCheck += Abc_Clock() - clk;
    if ( memcmp( p->pTemp1, pTruth, p->nWords * sizeof(word) ) != 0 )
    {
/*
        Kit_DsdPrintFromTruth( pTruth, nLeaves ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned *)p->pTemp1, nLeaves ); printf( "\n" );
        printf( "Truth table verification has failed.\n" );
*/
        // drive PO with constant
        Gia_ManPatchCoDriver( pGia, Gia_ManCoNum(pGia)-1, 0 );
        // save truth table ID
        Vec_IntPush( p->vTruthIds, -1 );
        p->nFilterTruth++;
        return 1;
    }

clk = Abc_Clock();
    // add the resulting truth table to the hash table 
    Index = Vec_MemHashInsert( p->vTtMem, p->pTemp1 );
    // save truth table ID
    Vec_IntPush( p->vTruthIds, Index );
    assert( Gia_ManCoNum(pGia) == Vec_IntSize(p->vTruthIds) );
    p->nAdded++;
p->timeInsert += Abc_Clock() - clk;
    return 1;
}